

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyDispatchComputeAttribs(DispatchComputeAttribs *Attribs)

{
  undefined *puVar1;
  undefined8 uVar2;
  undefined1 local_80 [8];
  string _msg_2;
  string _msg_1;
  undefined1 local_30 [8];
  string _msg;
  DispatchComputeAttribs *Attribs_local;
  
  _msg.field_2._8_8_ = Attribs;
  if (Attribs->ThreadGroupCountX == 0) {
    FormatString<char[125]>
              ((string *)local_30,
               (char (*) [125])
               "DispatchComputeAttribs.ThreadGroupCountX is 0. This is OK as the dispatch command will be ignored, but may be unintentional."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_30);
  }
  if (*(int *)(_msg.field_2._8_8_ + 4) == 0) {
    FormatString<char[125]>
              ((string *)((long)&_msg_2.field_2 + 8),
               (char (*) [125])
               "DispatchComputeAttribs.ThreadGroupCountY is 0. This is OK as the dispatch command will be ignored, but may be unintentional."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar2,0);
    }
    std::__cxx11::string::~string((string *)(_msg_2.field_2._M_local_buf + 8));
  }
  if (*(int *)(_msg.field_2._8_8_ + 8) == 0) {
    FormatString<char[125]>
              ((string *)local_80,
               (char (*) [125])
               "DispatchComputeAttribs.ThreadGroupCountZ is 0. This is OK as the dispatch command will be ignored, but may be unintentional."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  return true;
}

Assistant:

bool VerifyDispatchComputeAttribs(const DispatchComputeAttribs& Attribs)
{
    if (Attribs.ThreadGroupCountX == 0)
        LOG_INFO_MESSAGE("DispatchComputeAttribs.ThreadGroupCountX is 0. This is OK as the dispatch command will be ignored, but may be unintentional.");
    if (Attribs.ThreadGroupCountY == 0)
        LOG_INFO_MESSAGE("DispatchComputeAttribs.ThreadGroupCountY is 0. This is OK as the dispatch command will be ignored, but may be unintentional.");
    if (Attribs.ThreadGroupCountZ == 0)
        LOG_INFO_MESSAGE("DispatchComputeAttribs.ThreadGroupCountZ is 0. This is OK as the dispatch command will be ignored, but may be unintentional.");

    return true;
}